

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_set_timeouts(tftp_state_data_t *state)

{
  tftp_state_t tVar1;
  int iVar2;
  timediff_t tVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  CURLcode CVar11;
  
  tVar1 = state->state;
  time(&state->start_time);
  tVar3 = Curl_timeleft(state->conn->data,(curltime *)0x0,tVar1 == TFTP_STATE_START);
  if (tVar3 < 0) {
    Curl_failf(state->conn->data,"Connection time-out");
    CVar11 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (tVar1 == TFTP_STATE_START) {
      uVar4 = (tVar3 + 500U) / 1000;
      lVar7 = state->start_time;
      lVar5 = lVar7 + uVar4;
      state->max_time = lVar5;
      uVar10 = 1;
      if (4 < (int)uVar4) {
        uVar10 = (ulong)(uint)((int)uVar4 / 5);
      }
    }
    else {
      if (tVar3 == 0) {
        uVar4 = 0xe10;
      }
      else {
        uVar4 = (tVar3 + 500U) / 1000;
      }
      lVar7 = state->start_time;
      lVar5 = lVar7 + uVar4;
      state->max_time = lVar5;
      uVar10 = (ulong)(uint)((int)uVar4 / 5);
    }
    uVar9 = (uint)uVar10;
    state->retry_max = uVar9;
    uVar6 = 3;
    if (((int)uVar9 < 3) || (uVar6 = 0x32, 0x32 < uVar9)) {
      state->retry_max = uVar6;
      uVar10 = (ulong)uVar6;
    }
    CVar11 = CURLE_OK;
    iVar2 = (int)(uVar4 / uVar10);
    iVar8 = 1;
    if (1 < iVar2) {
      iVar8 = iVar2;
    }
    state->retry_time = iVar8;
    Curl_infof(state->conn->data,"set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
               (ulong)state->state,lVar5 - lVar7);
    time(&state->rx_time);
  }
  return CVar11;
}

Assistant:

static CURLcode tftp_set_timeouts(tftp_state_data_t *state)
{
  time_t maxtime, timeout;
  timediff_t timeout_ms;
  bool start = (state->state == TFTP_STATE_START) ? TRUE : FALSE;

  time(&state->start_time);

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->conn->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->conn->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(start) {

    maxtime = (time_t)(timeout_ms + 500) / 1000;
    state->max_time = state->start_time + maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime;

    /* Average restart after 5 seconds */
    state->retry_max = (int)timeout/5;

    if(state->retry_max < 1)
      /* avoid division by zero below */
      state->retry_max = 1;

    /* Compute the re-start interval to suit the timeout */
    state->retry_time = (int)timeout/state->retry_max;
    if(state->retry_time<1)
      state->retry_time = 1;

  }
  else {
    if(timeout_ms > 0)
      maxtime = (time_t)(timeout_ms + 500) / 1000;
    else
      maxtime = 3600;

    state->max_time = state->start_time + maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime;

    /* Average reposting an ACK after 5 seconds */
    state->retry_max = (int)timeout/5;
  }
  /* But bound the total number */
  if(state->retry_max<3)
    state->retry_max = 3;

  if(state->retry_max>50)
    state->retry_max = 50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time<1)
    state->retry_time = 1;

  infof(state->conn->data,
        "set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
        (int)state->state, (long)(state->max_time-state->start_time),
        state->retry_time, state->retry_max);

  /* init RX time */
  time(&state->rx_time);

  return CURLE_OK;
}